

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

String * Time::toString(String *__return_storage_ptr__,int64 time,char *format,bool utc)

{
  usize copyLength;
  ulong copyLength_00;
  tm *__tp;
  Data *pDVar1;
  size_t sVar2;
  ulong minCapacity;
  time_t timet;
  long local_20;
  
  if (*format == '\0') {
    __return_storage_ptr__->data = &String::emptyData.super_Data;
  }
  else {
    local_20 = time / 1000;
    if (utc) {
      __tp = gmtime(&local_20);
    }
    else {
      __tp = localtime(&local_20);
    }
    pDVar1 = (Data *)operator_new__(0x121);
    __return_storage_ptr__->data = pDVar1;
    pDVar1->str = (char *)(pDVar1 + 1);
    *(undefined1 *)&pDVar1[1].str = 0;
    pDVar1->len = 0;
    pDVar1->ref = 1;
    pDVar1->capacity = 0x100;
    if (__tp != (tm *)0x0) {
      while( true ) {
        copyLength = __return_storage_ptr__->data->len;
        String::detach(__return_storage_ptr__,copyLength,copyLength);
        pDVar1 = __return_storage_ptr__->data;
        if (pDVar1->ref == 1) {
          sVar2 = pDVar1->capacity;
        }
        else {
          sVar2 = 0;
        }
        sVar2 = strftime(pDVar1->str,sVar2,format,__tp);
        if (sVar2 != 0) break;
        pDVar1 = __return_storage_ptr__->data;
        if (pDVar1->ref == 1) {
          minCapacity = pDVar1->capacity * 2;
        }
        else {
          minCapacity = 0;
        }
        copyLength_00 = pDVar1->len;
        if (minCapacity < copyLength_00) {
          minCapacity = copyLength_00;
        }
        String::detach(__return_storage_ptr__,copyLength_00,minCapacity);
      }
      String::detach(__return_storage_ptr__,sVar2,sVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Time::toString(int64 time, const char* format, bool utc)
{
  if(!*format)
    return String();
  time_t timet = (time_t)(time / 1000);
  const tm* tms = utc ? ::gmtime(&timet) : ::localtime(&timet);
  String result(256);
  if(!tms)
    return result;
  char* buffer;
  usize len;
  for(;;)
  {
    buffer = result;
    len = strftime(buffer, result.capacity(), format, tms);
    if(len > 0)
      break;
    result.reserve(result.capacity() * 2);
  }
  result.resize(len);
  return result;
}